

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skills.c
# Opt level: O0

void check_improve(CHAR_DATA *ch,int sn,bool success,int multiplier)

{
  short sVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  CClass *this;
  int *piVar6;
  int in_ECX;
  long lVar7;
  byte in_DL;
  int in_ESI;
  CHAR_DATA *in_RDI;
  __type_conflict2 _Var8;
  char buf [100];
  float chance;
  int inum;
  int in_stack_0000113c;
  CHAR_DATA *in_stack_00001140;
  CHAR_DATA *in_stack_ffffffffffffff08;
  ulong uVar9;
  int from;
  undefined8 in_stack_ffffffffffffff10;
  CHAR_DATA *in_stack_ffffffffffffff18;
  char_data *in_stack_ffffffffffffff20;
  char *txt;
  int local_d8;
  int local_d4;
  undefined8 in_stack_ffffffffffffff38;
  CHAR_DATA *in_stack_ffffffffffffff40;
  int local_b0;
  int local_ac;
  int local_90;
  int local_8c;
  char local_88 [108];
  float local_1c;
  int local_18;
  int local_14;
  byte local_d;
  int local_c;
  CHAR_DATA *local_8;
  
  iVar4 = (int)((ulong)in_stack_ffffffffffffff38 >> 0x20);
  local_d = in_DL & 1;
  local_14 = in_ECX;
  local_c = in_ESI;
  local_8 = in_RDI;
  bVar2 = is_npc(in_stack_ffffffffffffff08);
  iVar5 = (int)((ulong)in_stack_ffffffffffffff08 >> 0x20);
  if (!bVar2) {
    bVar2 = is_affected_by(in_stack_ffffffffffffff18,(int)((ulong)in_stack_ffffffffffffff10 >> 0x20)
                          );
    from = (int)in_stack_ffffffffffffff10;
    if (!bVar2) {
      sVar1 = local_8->level;
      lVar7 = (long)local_c;
      this = char_data::Class(in_stack_ffffffffffffff20);
      iVar3 = CClass::GetIndex(this);
      if (((*(short *)(lVar7 * 0x60 + 0x8daef8 + (long)iVar3 * 2) <= sVar1) &&
          (10 < local_8->pcdata->learned[local_c])) && (local_8->pcdata->learned[local_c] < 100)) {
        iVar4 = get_curr_stat(in_stack_ffffffffffffff40,iVar4);
        local_1c = (float)((int)local_8->level << 1) +
                   (float)((int)int_app[iVar4].learn << 3) / (float)(local_14 << 2);
        uVar9 = local_8->act[0];
        _Var8 = std::pow<int,int>(0,0x6342d2);
        if ((uVar9 & (long)_Var8) != 0) {
          local_1c = local_1c / 4.0;
        }
        bVar2 = is_affected(local_8,(int)gsn_synaptic_enhancement);
        if (bVar2) {
          local_1c = local_1c * 1.5;
        }
        bVar2 = is_affected(local_8,(int)gsn_synaptic_impairment);
        if (bVar2) {
          local_1c = local_1c / 2.0;
        }
        iVar4 = number_range(from,iVar5);
        if ((float)iVar4 <= local_1c) {
          if ((local_d & 1) == 0) {
            if ((int)local_8->pcdata->learned[local_c] / 2 < 5) {
              local_d4 = 5;
            }
            else {
              if ((int)local_8->pcdata->learned[local_c] / 2 < 0x1f) {
                local_d8 = (int)local_8->pcdata->learned[local_c] / 2;
              }
              else {
                local_d8 = 0x1e;
              }
              local_d4 = local_d8;
            }
            local_1c = (float)local_d4;
            local_18 = number_range(from,iVar5);
            iVar5 = number_percent();
            if ((float)iVar5 < local_1c) {
              txt = (char *)local_8->comm[0];
              _Var8 = std::pow<int,int>(0,0x634802);
              if ((((ulong)txt & (long)_Var8) == 0) ||
                 (99 < local_8->pcdata->learned[local_c] + local_18)) {
                in_stack_ffffffffffffff18 = (CHAR_DATA *)local_8->comm[0];
                _Var8 = std::pow<int,int>(0,0x634894);
                if ((((ulong)in_stack_ffffffffffffff18 & (long)_Var8) == 0) &&
                   (local_8->pcdata->learned[local_c] + local_18 < 100)) {
                  sprintf(local_88,"You learn from your mistakes, and your %s skill improves.\n\r",
                          skill_table[local_c].name);
                }
                else {
                  uVar9 = local_8->comm[0];
                  _Var8 = std::pow<int,int>(0,0x634926);
                  if (((uVar9 & (long)_Var8) == 0) ||
                     (local_8->pcdata->learned[local_c] + local_18 != 100)) {
                    uVar9 = local_8->comm[0];
                    _Var8 = std::pow<int,int>(0,0x6349b7);
                    if (((uVar9 & (long)_Var8) == 0) &&
                       (local_8->pcdata->learned[local_c] + local_18 == 100)) {
                      sprintf(local_88,"You learn from your mistakes, and manage to perfect %s!\n\r"
                              ,skill_table[local_c].name);
                    }
                  }
                  else {
                    sprintf(local_88,
                            "\x1b[1;33mYou learn from your mistakes, and manage to perfect %s!\x1b[0m\n\r"
                            ,skill_table[local_c].name);
                  }
                }
              }
              else {
                sprintf(local_88,
                        "\x1b[1;33mYou learn from your mistakes, and your %s skill improves.\x1b[0m\n\r"
                        ,skill_table[local_c].name);
              }
              send_to_char(txt,in_stack_ffffffffffffff18);
              local_8->pcdata->learned[local_c] =
                   local_8->pcdata->learned[local_c] + (short)local_18;
              local_8c = (int)local_8->pcdata->learned[local_c];
              local_90 = 100;
              piVar6 = std::min<int>(&local_8c,&local_90);
              local_8->pcdata->learned[local_c] = (short)*piVar6;
              gain_exp(in_stack_00001140,in_stack_0000113c);
            }
          }
          else {
            if (100 - local_8->pcdata->learned[local_c] < 5) {
              local_ac = 5;
            }
            else {
              if (100 - local_8->pcdata->learned[local_c] < 0x60) {
                local_b0 = 100 - local_8->pcdata->learned[local_c];
              }
              else {
                local_b0 = 0x5f;
              }
              local_ac = local_b0;
            }
            local_1c = (float)local_ac;
            iVar5 = number_percent();
            if ((float)iVar5 < local_1c) {
              uVar9 = local_8->comm[0];
              _Var8 = std::pow<int,int>(0,0x63449e);
              if (((uVar9 & (long)_Var8) == 0) || (0x62 < local_8->pcdata->learned[local_c])) {
                uVar9 = local_8->comm[0];
                _Var8 = std::pow<int,int>(0,0x634529);
                if (((uVar9 & (long)_Var8) == 0) && (local_8->pcdata->learned[local_c] < 99)) {
                  sprintf(local_88,"You have become better at %s!\n\r",skill_table[local_c].name);
                }
                else {
                  uVar9 = local_8->comm[0];
                  _Var8 = std::pow<int,int>(0,0x6345b4);
                  if (((uVar9 & (long)_Var8) == 0) || (local_8->pcdata->learned[local_c] != 99)) {
                    uVar9 = local_8->comm[0];
                    _Var8 = std::pow<int,int>(0,0x63463f);
                    if (((uVar9 & (long)_Var8) == 0) && (local_8->pcdata->learned[local_c] == 99)) {
                      sprintf(local_88,"You have perfected %s!\n\r",skill_table[local_c].name);
                    }
                  }
                  else {
                    sprintf(local_88,"\x1b[1;33mYou have perfected %s!\x1b[0m\n\r",
                            skill_table[local_c].name);
                  }
                }
              }
              else {
                sprintf(local_88,"\x1b[1;33mYou have become better at %s!\x1b[0m\n\r",
                        skill_table[local_c].name);
              }
              send_to_char((char *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
              local_8->pcdata->learned[local_c] = local_8->pcdata->learned[local_c] + 1;
              gain_exp(in_stack_00001140,in_stack_0000113c);
            }
          }
        }
      }
    }
  }
  return;
}

Assistant:

void check_improve(CHAR_DATA *ch, int sn, bool success, int multiplier)
{
	int inum;
	float chance;
	char buf[100];

	if (is_npc(ch))
		return;

	if (is_affected_by(ch, AFF_CALM))
		return;

	if (ch->level < skill_table[sn].skill_level[ch->Class()->GetIndex()]
		|| ch->pcdata->learned[sn] <= 10
		|| ch->pcdata->learned[sn] >= 100)
	{
		return; /* skill is not known */
	}

	/* check to see if the character has a chance to learn */
	chance = 8 * int_app[get_curr_stat(ch, STAT_INT)].learn;
	chance /= (multiplier * 4);
	chance += ch->level * 2;

	if (IS_SET(ch->act, PLR_MORON))
		chance /= 4;

	if (is_affected(ch, gsn_synaptic_enhancement))
		chance *= 1.5;

	if (is_affected(ch, gsn_synaptic_impairment))
		chance /= 2;

	if (number_range(1, 1000) > chance)
		return;

	/* now that the character has a CHANCE to learn, see if they really have */

	if (success)
	{
		chance = URANGE(5, 100 - ch->pcdata->learned[sn], 95);

		if (number_percent() < chance)
		{
			if (IS_SET(ch->comm, COMM_ANSI) && ch->pcdata->learned[sn] < 99)
				sprintf(buf, "[1;33mYou have become better at %s![0m\n\r", skill_table[sn].name);
			else if (!IS_SET(ch->comm, COMM_ANSI) && ch->pcdata->learned[sn] < 99)
				sprintf(buf, "You have become better at %s!\n\r", skill_table[sn].name);
			else if (IS_SET(ch->comm, COMM_ANSI) && ch->pcdata->learned[sn] == 99)
				sprintf(buf, "[1;33mYou have perfected %s![0m\n\r", skill_table[sn].name);
			else if (!IS_SET(ch->comm, COMM_ANSI) && ch->pcdata->learned[sn] == 99)
				sprintf(buf, "You have perfected %s!\n\r", skill_table[sn].name);

			send_to_char(buf, ch);
			ch->pcdata->learned[sn]++;
			gain_exp(ch, 4);
		}
	}
	else
	{
		chance = URANGE(5, ch->pcdata->learned[sn] / 2, 30);
		inum = number_range(1, 3);

		if (number_percent() < chance)
		{
			if (IS_SET(ch->comm, COMM_ANSI) && (ch->pcdata->learned[sn] + inum) < 100)
				sprintf(buf, "[1;33mYou learn from your mistakes, and your %s skill improves.[0m\n\r", skill_table[sn].name);
			else if (!IS_SET(ch->comm, COMM_ANSI) && (ch->pcdata->learned[sn] + inum) < 100)
				sprintf(buf, "You learn from your mistakes, and your %s skill improves.\n\r", skill_table[sn].name);
			else if (IS_SET(ch->comm, COMM_ANSI) && ch->pcdata->learned[sn] + inum == 100)
				sprintf(buf, "[1;33mYou learn from your mistakes, and manage to perfect %s![0m\n\r", skill_table[sn].name);
			else if (!IS_SET(ch->comm, COMM_ANSI) && ch->pcdata->learned[sn] + inum == 100)
				sprintf(buf, "You learn from your mistakes, and manage to perfect %s!\n\r", skill_table[sn].name);

			send_to_char(buf, ch);
			ch->pcdata->learned[sn] += inum;
			ch->pcdata->learned[sn] = std::min((int)ch->pcdata->learned[sn], 100);
			gain_exp(ch, 4);
		}
	}
}